

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

int m2v_LU_det(m2v *LU)

{
  int iVar1;
  int r;
  int iVar2;
  int iVar3;
  
  iVar3 = LU->n_col;
  r = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  iVar2 = 1;
  for (; iVar3 != r; r = r + 1) {
    iVar1 = m2v_get_el(LU,r,r);
    iVar2 = iVar2 * iVar1;
  }
  return iVar2;
}

Assistant:

MV_GEN_ELTYPE MV_GEN_N(_LU_det)(const MV_GEN_TYPE* LU)
{
	assert(LU->n_row == LU->n_col);

	MV_GEN_ELTYPE det = 1;
	for (int i = 0; i < LU->n_col; ++i) {
		det = fmul(det, MV_GEN_N(_get_el)(LU, i, i));
	}

	return det;
}